

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupExor(Aig_Man_t *p)

{
  int iVar1;
  Aig_Type_t Type;
  Aig_Man_t *p_00;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  Tim_Man_t *pTVar5;
  int local_2c;
  Aig_Obj_t *pAStack_28;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  p_00->fCatchExor = 1;
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar3;
  }
  Aig_ManCleanData(p);
  local_2c = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_2c) {
      Aig_ManCleanup(p_00);
      iVar1 = Aig_ManRegNum(p);
      Aig_ManSetRegNum(p_00,iVar1);
      if (p->pManTime != (void *)0x0) {
        pTVar5 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
        p_00->pManTime = pTVar5;
      }
      iVar1 = Aig_ManCheck(p_00);
      if (iVar1 == 0) {
        printf("Aig_ManDupExor(): The check has failed.\n");
      }
      return p_00;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if (pObj_00 != (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjIsBuf(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj_00);
        if (iVar1 == 0) {
          iVar1 = Aig_ObjIsCi(pObj_00);
          if (iVar1 == 0) {
            iVar1 = Aig_ObjIsCo(pObj_00);
            if (iVar1 == 0) {
              iVar1 = Aig_ObjIsConst1(pObj_00);
              if (iVar1 == 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDup.c"
                              ,0x1f8,"Aig_Man_t *Aig_ManDupExor(Aig_Man_t *)");
              }
              pAStack_28 = Aig_ManConst1(p_00);
            }
            else {
              pAVar4 = Aig_ObjChild0Copy(pObj_00);
              pAStack_28 = Aig_ObjCreateCo(p_00,pAVar4);
            }
          }
          else {
            pAStack_28 = Aig_ObjCreateCi(p_00);
            *(ulong *)&pAStack_28->field_0x18 =
                 *(ulong *)&pAStack_28->field_0x18 & 0xff000000ffffffff |
                 (ulong)((uint)((ulong)*(undefined8 *)&pObj_00->field_0x18 >> 0x20) & 0xffffff) <<
                 0x20;
          }
        }
        else {
          pAVar4 = Aig_ObjChild0Copy(pObj_00);
          p1 = Aig_ObjChild1Copy(pObj_00);
          Type = Aig_ObjType(pObj_00);
          pAStack_28 = Aig_Oper(p_00,pAVar4,p1,Type);
        }
      }
      else {
        pAStack_28 = Aig_ObjChild0Copy(pObj_00);
      }
      (pObj_00->field_5).pData = pAStack_28;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManDupExor( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->fCatchExor = 1;
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // create the PIs
    Aig_ManCleanData( p );
    // duplicate internal nodes
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsBuf(pObj) )
        {
            pObjNew = Aig_ObjChild0Copy(pObj);
        }
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
        }
        else if ( Aig_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi( pNew );
            pObjNew->Level = pObj->Level;
        }
        else if ( Aig_ObjIsCo(pObj) )
        {
            pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        }
        else if ( Aig_ObjIsConst1(pObj) )
        {
            pObjNew = Aig_ManConst1(pNew);
        }
        else
            assert( 0 );
        pObj->pData = pObjNew;
    }
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupExor(): The check has failed.\n" );
    return pNew;
}